

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

int __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
::FindEntry<Js::DynamicType>
          (WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
           *this,DynamicType *key)

{
  hash_t hVar1;
  int iVar2;
  uint key_00;
  hash_t local_28;
  int local_24;
  uint bucket;
  int previous;
  
  if ((this->buckets).ptr != (int *)0x0) {
    key_00 = (uint)((ulong)key >> 3) | 1;
    hVar1 = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
    _local_28 = CONCAT44(0xffffffff,hVar1);
    iVar2 = FindEntry<Js::DynamicType>(this,key,key_00,&local_28,&local_24);
    return iVar2;
  }
  return -1;
}

Assistant:

inline int FindEntry(const TLookup* key)
        {
            if (buckets != nullptr)
            {
                hash_t hash = GetHashCode(key);
                uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                int previous = -1;
                return FindEntry(key, hash, bucket, previous);
            }

            return -1;
        }